

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  time_t tVar3;
  void *pvVar4;
  void *pvVar5;
  int *piVar6;
  small_alloc_info *psVar7;
  ulong uVar8;
  ulong uVar9;
  int extraout_EDX;
  uint uVar10;
  small_alloc *info;
  slab_cache *psVar11;
  int iVar12;
  small_alloc *psVar13;
  int iVar14;
  pthread_t *actual_alloc_factor;
  float *actual_alloc_factor_00;
  long lVar15;
  small_alloc_info *arena;
  slab_cache *psVar16;
  int i;
  char *cache;
  long lVar17;
  undefined1 auStack_338 [24];
  rlist *prStack_320;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int iStack_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  small_alloc *psStack_2f8;
  undefined *puStack_2f0;
  char *pcStack_2e8;
  small_alloc_info *psStack_2e0;
  slab_cache *psStack_2d8;
  code *pcStack_2d0;
  undefined1 local_2c8 [8];
  slab_cache cache1;
  slab_arena arena1;
  quota quota1;
  
  pcStack_2d0 = (code *)0x102ada;
  plan(4);
  pcStack_2d0 = (code *)0x102aea;
  _space((FILE *)_stdout);
  pcStack_2d0 = (code *)0x102b02;
  printf("# *** %s ***\n","main");
  pcStack_2d0 = (code *)0x102b09;
  tVar3 = time((time_t *)0x0);
  seed = (uint)tVar3;
  pcStack_2d0 = (code *)0x102b18;
  _space((FILE *)_stdout);
  pcStack_2d0 = (code *)0x102b32;
  fwrite("# ",2,1,_stdout);
  pcStack_2d0 = (code *)0x102b4a;
  fprintf(_stdout,"random seed is %u",(ulong)seed);
  pcStack_2d0 = (code *)0x102b58;
  fputc(10,_stdout);
  pcStack_2d0 = (code *)0x102b63;
  srand(seed);
  quota.value = 0x40000000000000;
  pcStack_2d0 = (code *)0x102b97;
  slab_arena_create(&::arena,&quota,0,4000000,2);
  pcStack_2d0 = (code *)0x102ba6;
  slab_cache_create(&::cache,&::arena);
  pcStack_2d0 = (code *)0x102bb0;
  plan(1);
  pcStack_2d0 = (code *)0x102bb9;
  _space((FILE *)_stdout);
  pcStack_2d0 = (code *)0x102bcd;
  printf("# *** %s ***\n","small_alloc_basic");
  pcStack_2d0 = (code *)0x102bec;
  small_alloc_test(0xc,5000,1000,0x400,5000);
  pcStack_2d0 = (code *)0x102c1b;
  _ok(1,"true",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",0x75,
      "line %d",0x75);
  pcStack_2d0 = (code *)0x102c24;
  _space((FILE *)_stdout);
  cache = "# *** %s: done ***\n";
  pcStack_2d0 = (code *)0x102c38;
  printf("# *** %s: done ***\n","small_alloc_basic");
  pcStack_2d0 = (code *)0x102c3d;
  check_plan();
  pcStack_2d0 = (code *)0x102c47;
  plan(1);
  pcStack_2d0 = (code *)0x102c50;
  _space((FILE *)_stdout);
  pcStack_2d0 = (code *)0x102c64;
  printf("# *** %s ***\n","small_alloc_large");
  pcStack_2d0 = (code *)0x102c8e;
  small_alloc_test((::cache.arena)->slab_size - 0x70 >> 4 & 0xfffffff8,
                   (::cache.arena)->slab_size * 2,0x32,10,100);
  pcStack_2d0 = (code *)0x102cb6;
  _ok(1,"true",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",0x86,
      "line %d",0x86);
  pcStack_2d0 = (code *)0x102cbf;
  _space((FILE *)_stdout);
  pcStack_2d0 = (code *)0x102ccc;
  printf("# *** %s: done ***\n","small_alloc_large");
  pcStack_2d0 = (code *)0x102cd1;
  check_plan();
  pcStack_2d0 = (code *)0x102cdb;
  plan(1);
  pcStack_2d0 = (code *)0x102ce4;
  _space((FILE *)_stdout);
  pcStack_2d0 = (code *)0x102cf5;
  printf("# *** %s ***\n","test_small_alloc_info");
  info = &alloc;
  actual_alloc_factor = &cache1.thread_id;
  pcStack_2d0 = (code *)0x102d21;
  small_alloc_create(&alloc,&::cache,0x40,0x40,1.5,(float *)actual_alloc_factor);
  iVar14 = (int)actual_alloc_factor;
  arena = (small_alloc_info *)local_2c8;
  iVar12 = 0x10d3b8;
  iVar2 = 0;
  pcStack_2d0 = (code *)0x102d3a;
  psVar7 = arena;
  small_alloc_info(&alloc,(void *)0x0,0x101,arena);
  iVar1 = (int)psVar7;
  if (local_2c8[0] == false) {
    if (cache1.arena != (slab_arena *)0x200) goto LAB_00103047;
    iVar12 = 0x10d3b8;
    info = (small_alloc *)local_2c8;
    iVar2 = 0;
    pcStack_2d0 = (code *)0x102d72;
    psVar13 = info;
    small_alloc_info(&alloc,(void *)0x0,0x200,(small_alloc_info *)info);
    iVar1 = (int)psVar13;
    if (local_2c8[0] != false) goto LAB_0010304c;
    if (cache1.arena != (slab_arena *)0x200) goto LAB_00103051;
    iVar12 = 0x10d3b8;
    iVar2 = 0;
    pcStack_2d0 = (code *)0x102da2;
    psVar13 = info;
    small_alloc_info(&alloc,(void *)0x0,0x4001,(small_alloc_info *)info);
    iVar1 = (int)psVar13;
    if (local_2c8[0] != false) goto LAB_00103056;
    if (cache1.arena != (slab_arena *)0x40000) goto LAB_0010305b;
    iVar12 = 0x10d3b8;
    iVar2 = 0;
    pcStack_2d0 = (code *)0x102dd2;
    psVar13 = info;
    small_alloc_info(&alloc,(void *)0x0,0x40000,(small_alloc_info *)info);
    iVar1 = (int)psVar13;
    if (local_2c8[0] != false) goto LAB_00103060;
    if (cache1.arena != (slab_arena *)0x40000) goto LAB_00103065;
    iVar12 = 0x10d3b8;
    iVar2 = 0;
    pcStack_2d0 = (code *)0x102e02;
    psVar13 = info;
    small_alloc_info(&alloc,(void *)0x0,0x40001,(small_alloc_info *)info);
    iVar1 = (int)psVar13;
    if (local_2c8[0] == false) goto LAB_0010306a;
    if (cache1.arena != (slab_arena *)0x40001) goto LAB_0010306f;
    pcStack_2d0 = (code *)0x102e48;
    _ok(1,"true",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",
        0xb5,"line %d",0xb5);
    info = &alloc;
    pcStack_2d0 = (code *)0x102e57;
    small_alloc_destroy(&alloc);
    pcStack_2d0 = (code *)0x102e60;
    _space((FILE *)_stdout);
    pcStack_2d0 = (code *)0x102e75;
    printf("# *** %s: done ***\n","test_small_alloc_info");
    pcStack_2d0 = (code *)0x102e7a;
    check_plan();
    pcStack_2d0 = (code *)0x102e84;
    plan(1);
    pcStack_2d0 = (code *)0x102e8d;
    _space((FILE *)_stdout);
    pcStack_2d0 = (code *)0x102ea2;
    printf("# *** %s ***\n","small_alloc_low_alloc_factor");
    arena1.slab_size = 0;
    arena1.flags = 0x400;
    arena = (small_alloc_info *)&cache1.thread_id;
    pcStack_2d0 = (code *)0x102ecc;
    slab_arena_create((slab_arena *)arena,(quota *)&arena1.slab_size,0,4000000,2);
    cache = local_2c8;
    pcStack_2d0 = (code *)0x102ede;
    slab_cache_create((slab_cache *)cache,(slab_arena *)arena);
    actual_alloc_factor_00 = (float *)((long)&quota1.value + 4);
    iVar12 = 0x10d3b8;
    iVar1 = 8;
    pcStack_2d0 = (code *)0x102eff;
    psVar11 = (slab_cache *)cache;
    small_alloc_create(&alloc,(slab_cache *)cache,0xc,8,1.001,actual_alloc_factor_00);
    iVar2 = (int)psVar11;
    iVar14 = (int)actual_alloc_factor_00;
    if (alloc.small_mempool_cache_size != 0x400) goto LAB_00103074;
    if (alloc.objsize_max < 0x400) goto LAB_00103079;
    iVar12 = 0x400;
    iVar2 = 8;
    pcStack_2d0 = (code *)0x102f2e;
    pvVar4 = calloc(0x400,8);
    if (pvVar4 != (void *)0x0) {
      lVar17 = 0;
      do {
        pcStack_2d0 = (code *)0x102f51;
        pvVar5 = smalloc(&alloc,0x400);
        if (pvVar5 == (void *)0x0) break;
        *(void **)((long)pvVar4 + lVar17 * 8) = pvVar5;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x400);
      lVar17 = 0;
      do {
        pvVar5 = *(void **)((long)pvVar4 + lVar17 * 8);
        if (pvVar5 == (void *)0x0) break;
        pcStack_2d0 = (code *)0x102f86;
        smfree(&alloc,pvVar5,0x400);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x400);
      pcStack_2d0 = (code *)0x102f9e;
      small_alloc_destroy(&alloc);
      pcStack_2d0 = (code *)0x102faa;
      slab_cache_destroy((slab_cache *)local_2c8);
      pcStack_2d0 = (code *)0x102fb3;
      slab_arena_destroy((slab_arena *)&cache1.thread_id);
      pcStack_2d0 = (code *)0x102fdf;
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",
          0xee,"line %d",0xee);
      pcStack_2d0 = (code *)0x102fe8;
      _space((FILE *)_stdout);
      pcStack_2d0 = (code *)0x103000;
      printf("# *** %s: done ***\n","small_alloc_low_alloc_factor");
      pcStack_2d0 = (code *)0x103005;
      check_plan();
      pcStack_2d0 = (code *)0x103011;
      slab_cache_destroy(&::cache);
      pcStack_2d0 = (code *)0x10301a;
      _space((FILE *)_stdout);
      pcStack_2d0 = (code *)0x10302b;
      printf("# *** %s: done ***\n","main");
      pcStack_2d0 = (code *)0x103030;
      iVar1 = check_plan();
      return iVar1;
    }
  }
  else {
    pcStack_2d0 = (code *)0x103047;
    main_cold_1();
LAB_00103047:
    pcStack_2d0 = (code *)0x10304c;
    main_cold_2();
LAB_0010304c:
    pcStack_2d0 = (code *)0x103051;
    main_cold_3();
LAB_00103051:
    pcStack_2d0 = (code *)0x103056;
    main_cold_4();
LAB_00103056:
    pcStack_2d0 = (code *)0x10305b;
    main_cold_5();
LAB_0010305b:
    pcStack_2d0 = (code *)0x103060;
    main_cold_6();
LAB_00103060:
    pcStack_2d0 = (code *)0x103065;
    main_cold_7();
LAB_00103065:
    pcStack_2d0 = (code *)0x10306a;
    main_cold_8();
LAB_0010306a:
    pcStack_2d0 = (code *)0x10306f;
    main_cold_13();
LAB_0010306f:
    pcStack_2d0 = (code *)0x103074;
    main_cold_9();
LAB_00103074:
    pcStack_2d0 = (code *)0x103079;
    main_cold_10();
LAB_00103079:
    pcStack_2d0 = (code *)0x10307e;
    main_cold_11();
  }
  pcStack_2d0 = small_alloc_test;
  main_cold_12();
  pcStack_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c";
  puStack_2f0 = &stdout;
  psVar13 = &alloc;
  psVar11 = &::cache;
  iStack_314 = extraout_EDX;
  iStack_308 = iVar1;
  iStack_300 = iVar2;
  iStack_2fc = iVar12;
  psStack_2f8 = info;
  psStack_2e0 = arena;
  psStack_2d8 = (slab_cache *)cache;
  pcStack_2d0 = (code *)&stack0xfffffffffffffff8;
  small_alloc_create(&alloc,&::cache,0xc,8,1.3,(float *)(auStack_338 + 0x14));
  iStack_304 = iVar14;
  if (0 < iVar14) {
    iStack_310 = iStack_300 - iStack_2fc;
    iVar1 = 0;
    do {
      iStack_30c = iVar1;
      iVar1 = rand();
      uVar9 = (long)iVar1 % (long)iStack_308 & 0xffffffff;
      if (0 < (int)((long)iVar1 % (long)iStack_308)) {
        do {
          iVar1 = rand();
          iVar1 = iVar1 % iStack_314;
          if (iStack_300 <= iStack_2fc) {
LAB_001032c9:
            __assert_fail("size_max > size_min",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
                          ,0x28,"void *alloc_checked(int, int, int)");
          }
          iVar2 = rand();
          iVar2 = iVar2 % iStack_310;
          psVar16 = (slab_cache *)ptrs[iVar1];
          if (psVar16 != (slab_cache *)0x0) {
            iVar12 = *(int *)&psVar16->arena;
            if (iVar12 != iVar1) {
LAB_001032ed:
              __assert_fail("ptrs[pos][0] == pos",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
                            ,0x2c,"void *alloc_checked(int, int, int)");
            }
            if ((999 < iVar12) ||
               (uVar8 = (ulong)*(int *)((long)&psVar16->arena + 4),
               *(int *)((long)psVar16->orders + ((uVar8 & 0xfffffffffffffffc) - 0x34)) != iVar12)) {
              small_alloc_test_cold_1();
              goto LAB_001032c9;
            }
            psVar11 = (slab_cache *)ptrs[iVar12];
            if (psVar11 != psVar16) {
              small_alloc_test_cold_2();
              goto LAB_001032ed;
            }
            *(undefined4 *)((long)psVar11->orders + ((uVar8 & 0xfffffffffffffffc) - 0x34)) =
                 0x7fffffff;
            *(undefined4 *)&psVar11->arena = 0x7fffffff;
            psVar13 = &alloc;
            smfree(&alloc,psVar11,(long)*(int *)((long)&psVar11->arena + 4));
            ptrs[iVar12] = (int *)0x0;
          }
          if (allocating == true) {
            iVar2 = iVar2 + iStack_2fc;
            psVar16 = (slab_cache *)(long)iVar2;
            psVar13 = &alloc;
            psVar11 = psVar16;
            piVar6 = (int *)smalloc(&alloc,(size_t)psVar16);
            if (piVar6 == (int *)0x0) {
              small_alloc_test_cold_7();
              goto LAB_00103311;
            }
            ptrs[iVar1] = piVar6;
            *piVar6 = iVar1;
            piVar6[1] = iVar2;
            *(int *)((long)piVar6 + (((ulong)psVar16 & 0xfffffffffffffffc) - 4)) = iVar1;
          }
          uVar10 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar10;
        } while (uVar10 != 0);
      }
      allocating = (_Bool)(allocating ^ 1);
      iVar1 = iStack_30c + 1;
    } while (iVar1 != iStack_304);
  }
  lVar17 = 0;
  do {
    psVar16 = *(slab_cache **)((long)ptrs + lVar17);
    if (psVar16 != (slab_cache *)0x0) {
      lVar15 = (long)*(int *)&psVar16->arena;
      if ((999 < lVar15) ||
         (uVar9 = (ulong)*(int *)((long)&psVar16->arena + 4),
         *(int *)((long)psVar16->orders + ((uVar9 & 0xfffffffffffffffc) - 0x34)) !=
         *(int *)&psVar16->arena)) goto LAB_00103311;
      psVar11 = (slab_cache *)ptrs[lVar15];
      if (psVar11 != psVar16) goto LAB_00103316;
      *(undefined4 *)((long)psVar11->orders + ((uVar9 & 0xfffffffffffffffc) - 0x34)) = 0x7fffffff;
      *(undefined4 *)&psVar11->arena = 0x7fffffff;
      psVar13 = &alloc;
      smfree(&alloc,psVar11,(long)*(int *)((long)&psVar11->arena + 4));
      ptrs[lVar15] = (int *)0x0;
    }
    lVar17 = lVar17 + 8;
  } while (lVar17 != 8000);
  prStack_320 = (rlist *)0x0;
  psVar13 = &alloc;
  psVar11 = (slab_cache *)auStack_338;
  small_stats(&alloc,(small_stats *)psVar11,small_is_unused_cb,&prStack_320);
  if ((slab_arena *)auStack_338._0_8_ == (slab_arena *)0x0) {
    if (::cache.allocated.stats.used <= prStack_320) {
      small_alloc_destroy(&alloc);
      return extraout_EAX;
    }
    goto LAB_00103320;
  }
  goto LAB_0010331b;
LAB_00103311:
  small_alloc_test_cold_3();
LAB_00103316:
  small_alloc_test_cold_4();
LAB_0010331b:
  small_alloc_test_cold_5();
LAB_00103320:
  small_alloc_test_cold_6();
  psVar11->arena =
       (slab_arena *)
       ((long)&(psVar11->arena->cache).next +
       (ulong)(uint)(*(int *)((long)&psVar13->small_mempool_cache[0].pool.cache + 4) *
                    *(int *)&psVar13->small_mempool_cache[0].pool.cache));
  return 0;
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(3);
#else
	plan(4);
#endif
	header();

	seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);

	quota_init(&quota, UINT_MAX);
	slab_arena_create(&arena, &quota, 0, 4000000,
			  MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	small_alloc_basic();
#ifndef ENABLE_ASAN
	small_alloc_large();
	test_small_alloc_info();
	small_alloc_low_alloc_factor();
#else
	small_wrong_size_in_free();
	small_membership();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}